

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O0

vector<Range,_std::allocator<Range>_> *
addRanges(vector<Range,_std::allocator<Range>_> *__return_storage_ptr__,Range *limits,
         vector<Range,_std::allocator<Range>_> *ranges,
         vector<Range,_std::allocator<Range>_> *additions)

{
  bool bVar1;
  reference pRVar2;
  Range *addition;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Range,_std::allocator<Range>_> *__range1_1;
  Range *range;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Range,_std::allocator<Range>_> *__range1;
  vector<Range,_std::allocator<Range>_> *additions_local;
  vector<Range,_std::allocator<Range>_> *ranges_local;
  Range *limits_local;
  vector<Range,_std::allocator<Range>_> *results;
  
  std::vector<Range,_std::allocator<Range>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<Range,_std::allocator<Range>_>::begin(ranges);
  range = (Range *)std::vector<Range,_std::allocator<Range>_>::end(ranges);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Range_*,_std::vector<Range,_std::allocator<Range>_>_>
                                     *)&range), bVar1) {
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_Range_*,_std::vector<Range,_std::allocator<Range>_>_>::
             operator*(&__end1);
    bVar1 = Range::overlaps(limits,pRVar2);
    if (bVar1) {
      std::vector<Range,_std::allocator<Range>_>::push_back(__return_storage_ptr__,pRVar2);
    }
    __gnu_cxx::__normal_iterator<const_Range_*,_std::vector<Range,_std::allocator<Range>_>_>::
    operator++(&__end1);
  }
  __end1_1 = std::vector<Range,_std::allocator<Range>_>::begin(additions);
  addition = (Range *)std::vector<Range,_std::allocator<Range>_>::end(additions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_Range_*,_std::vector<Range,_std::allocator<Range>_>_>
                             *)&addition), bVar1) {
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_Range_*,_std::vector<Range,_std::allocator<Range>_>_>::
             operator*(&__end1_1);
    bVar1 = Range::overlaps(limits,pRVar2);
    if (bVar1) {
      std::vector<Range,_std::allocator<Range>_>::push_back(__return_storage_ptr__,pRVar2);
    }
    __gnu_cxx::__normal_iterator<const_Range_*,_std::vector<Range,_std::allocator<Range>_>_>::
    operator++(&__end1_1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector <Range> addRanges (
  const Range& limits,
  const std::vector <Range>& ranges,
  const std::vector <Range>& additions)
{
  std::vector <Range> results;

  for (auto& range : ranges)
    if (limits.overlaps (range))
      results.push_back (range);

  for (auto& addition : additions)
    if (limits.overlaps (addition))
      results.push_back (addition);

  return results;
}